

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

uint __thiscall
ON_MeshComponentRef::GetMeshTopologyVertexAndPoint
          (ON_MeshComponentRef *this,ON_MeshTopologyVertex **topv,ON_3dPoint *point)

{
  ON_MeshTopologyVertex *pOVar1;
  uint uVar2;
  TYPE TVar3;
  uint uVar4;
  ON_MeshTopologyVertex *pOVar5;
  uint *puVar6;
  double dVar7;
  ON_MeshTopology *pOVar8;
  ON_3dPointListRef vertex_list;
  ON_3dPointListRef local_40;
  
  if (((this->m_mesh != (ON_Mesh *)0x0) && (-1 < (this->m_mesh_ci).m_index)) &&
     (pOVar8 = MeshTopology(this), pOVar8 != (ON_MeshTopology *)0x0)) {
    ON_3dPointListRef::ON_3dPointListRef(&local_40,this->m_mesh);
    uVar2 = (pOVar8->m_topv_map).m_count;
    if (uVar2 == local_40.m_point_count) {
      TVar3 = (this->m_mesh_ci).m_type;
      if (TVar3 == meshtop_vertex) {
        uVar4 = (this->m_mesh_ci).m_index;
        if (uVar4 < (uint)(pOVar8->m_topv).m_count) {
          pOVar5 = (pOVar8->m_topv).m_a;
          pOVar1 = pOVar5 + (int)uVar4;
          *topv = pOVar1;
          if (((pOVar5[(int)uVar4].m_v_count < 1) ||
              (puVar6 = (uint *)pOVar1->m_vi, puVar6 == (uint *)0x0)) ||
             (uVar4 = *puVar6, uVar2 <= uVar4 || (int)uVar4 < 0)) {
            point->z = ON_3dPoint::UnsetPoint.z;
            dVar7 = ON_3dPoint::UnsetPoint.y;
            point->x = ON_3dPoint::UnsetPoint.x;
            point->y = dVar7;
          }
          else {
            ON_3dPointListRef::GetPoint(&local_40,uVar4,&point->x);
          }
          return (this->m_mesh_ci).m_index;
        }
      }
      else if (TVar3 == mesh_vertex) {
        uVar4 = (this->m_mesh_ci).m_index;
        if (uVar4 < uVar2) {
          uVar2 = (pOVar8->m_topv_map).m_a[(int)uVar4];
          if ((-1 < (long)(int)uVar2) && ((int)uVar2 < (pOVar8->m_topv).m_count)) {
            *topv = (pOVar8->m_topv).m_a + (int)uVar2;
            ON_3dPointListRef::GetPoint(&local_40,uVar4,&point->x);
            return uVar2;
          }
        }
      }
    }
  }
  *topv = (ON_MeshTopologyVertex *)0x0;
  point->z = ON_3dPoint::UnsetPoint.z;
  dVar7 = ON_3dPoint::UnsetPoint.y;
  point->x = ON_3dPoint::UnsetPoint.x;
  point->y = dVar7;
  return 0xffffffff;
}

Assistant:

unsigned int ON_MeshComponentRef::GetMeshTopologyVertexAndPoint(
  const struct ON_MeshTopologyVertex*& topv,
  class ON_3dPoint& point
  ) const
{
  if ( m_mesh && m_mesh_ci.m_index >= 0 )
  {
    const ON_MeshTopology* top = MeshTopology();
    if ( 0 != top )
    {
      const ON_3dPointListRef vertex_list(m_mesh);
      if ( top->m_topv_map.UnsignedCount() == vertex_list.PointCount() )
      {
        switch(m_mesh_ci.m_type)
        {
        case ON_COMPONENT_INDEX::mesh_vertex:
          if ( (unsigned int)m_mesh_ci.m_index < vertex_list.PointCount() )
          {
            int tvi = top->m_topv_map[m_mesh_ci.m_index];
            if ( tvi >= 0 && tvi < top->m_topv.Count() )
            {
              topv = &top->m_topv[tvi];
              vertex_list.GetPoint(m_mesh_ci.m_index,&point.x);
              return (unsigned int)tvi;
            }
          }
          break;

        case ON_COMPONENT_INDEX::meshtop_vertex:
          if ( (unsigned int)m_mesh_ci.m_index < top->m_topv.UnsignedCount() )
          {
            const ON_MeshTopologyVertex& v = top->m_topv[m_mesh_ci.m_index];
            topv = &v;
            if ( v.m_v_count > 0 && 0 != v.m_vi && v.m_vi[0] >= 0 && (unsigned int)v.m_vi[0] < vertex_list.PointCount() )
              vertex_list.GetPoint(v.m_vi[0],&point.x);
            else
              point = ON_3dPoint::UnsetPoint;
            return (unsigned int)m_mesh_ci.m_index;
          }
          break;
        
        default:
          break;
        }
      }
    }
  }

  topv = 0;
  point = ON_3dPoint::UnsetPoint;
  return ON_UNSET_UINT_INDEX;
}